

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_read_server_certificate(SSL_HANDSHAKE *hs)

{
  bool bVar1;
  undefined1 local_48 [8];
  SSLMessage msg;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  msg.raw.len = (size_t)hs->ssl;
  bVar1 = (*((SSL *)msg.raw.len)->method->get_message)((SSL *)msg.raw.len,(SSLMessage *)local_48);
  if (bVar1) {
    if ((local_48[1] == '\x19') ||
       (bVar1 = ssl_check_message_type((SSL *)msg.raw.len,(SSLMessage *)local_48,0xb), bVar1)) {
      bVar1 = tls13_process_certificate(hs,(SSLMessage *)local_48,false);
      if ((bVar1) && (bVar1 = ssl_hash_message(hs,(SSLMessage *)local_48), bVar1)) {
        (**(code **)(*(long *)msg.raw.len + 0x20))(msg.raw.len);
        hs->tls13_state = 6;
        hs_local._4_4_ = ssl_hs_ok;
      }
      else {
        hs_local._4_4_ = ssl_hs_error;
      }
    }
    else {
      hs_local._4_4_ = ssl_hs_error;
    }
  }
  else {
    hs_local._4_4_ = ssl_hs_read_message;
  }
  return hs_local._4_4_;
}

Assistant:

static enum ssl_hs_wait_t do_read_server_certificate(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;

  if (!ssl_cipher_uses_certificate_auth(hs->new_cipher)) {
    hs->state = state_read_certificate_status;
    return ssl_hs_ok;
  }

  SSLMessage msg;
  if (!ssl->method->get_message(ssl, &msg)) {
    return ssl_hs_read_message;
  }

  if (!ssl_check_message_type(ssl, msg, SSL3_MT_CERTIFICATE) ||
      !ssl_hash_message(hs, msg)) {
    return ssl_hs_error;
  }

  CBS body = msg.body;
  uint8_t alert = SSL_AD_DECODE_ERROR;
  if (!ssl_parse_cert_chain(&alert, &hs->new_session->certs, &hs->peer_pubkey,
                            NULL, &body, ssl->ctx->pool)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return ssl_hs_error;
  }

  if (sk_CRYPTO_BUFFER_num(hs->new_session->certs.get()) == 0 ||
      CBS_len(&body) != 0 ||
      !ssl->ctx->x509_method->session_cache_objects(hs->new_session.get())) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    return ssl_hs_error;
  }

  if (!ssl_check_leaf_certificate(
          hs, hs->peer_pubkey.get(),
          sk_CRYPTO_BUFFER_value(hs->new_session->certs.get(), 0))) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
    return ssl_hs_error;
  }

  ssl->method->next_message(ssl);

  hs->state = state_read_certificate_status;
  return ssl_hs_ok;
}